

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

void __thiscall jsonip::detail::struct_helper<P>::struct_helper(struct_helper<P> *this)

{
  initializer local_18;
  struct_helper<P> *local_10;
  struct_helper<P> *this_local;
  
  local_10 = this;
  struct_helper_base::struct_helper_base(&this->super_struct_helper_base);
  (this->super_struct_helper_base).super_helper._vptr_helper =
       (_func_int **)&PTR__struct_helper_0012bb68;
  initializer::initializer(&local_18,this);
  boost::mpl::for_each<boost::mpl::range_c<int,0,2>,jsonip::detail::struct_helper<P>::initializer>
            (local_18,(range_c<int,_0,_2> *)0x0);
  return;
}

Assistant:

struct_helper()
        {
            boost::mpl::for_each<range_t>(initializer(*this));
        }